

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

_Bool mfb_wait_sync(mfb_window *window)

{
  long lVar1;
  int iVar2;
  long *in_RDI;
  double dVar3;
  uint32_t millis;
  double current;
  XEvent event;
  SWindowData_X11 *window_data_x11;
  SWindowData *window_data;
  mfb_timer *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar4;
  undefined1 local_e0 [8];
  XEvent *in_stack_ffffffffffffff28;
  SWindowData *in_stack_ffffffffffffff30;
  _Bool local_1;
  
  if (in_RDI == (long *)0x0) {
    local_1 = true;
  }
  else if ((*(byte *)((long)in_RDI + 0x2a2) & 1) == 0) {
    lVar1 = *in_RDI;
    XFlush(*(undefined8 *)(lVar1 + 8));
    iVar4 = 1;
    while( true ) {
      iVar2 = XEventsQueued(*(undefined8 *)(lVar1 + 8),0);
      if (0 < iVar2) {
        XNextEvent(*(undefined8 *)(lVar1 + 8),local_e0);
        processEvent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      if ((*(byte *)((long)in_RDI + 0x2a2) & 1) != 0) {
        destroy_window_data((SWindowData *)CONCAT44(iVar4,in_stack_ffffffffffffff10));
        return false;
      }
      dVar3 = mfb_timer_now(in_stack_ffffffffffffff08);
      if (g_time_for_frame <= dVar3) break;
      if (g_time_for_frame * 0.8 <= dVar3) {
        iVar4 = 0;
      }
      usleep(iVar4 * 1000);
    }
    mfb_timer_reset((mfb_timer *)0x104ad4);
    local_1 = true;
  }
  else {
    destroy_window_data((SWindowData *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                       );
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool 
mfb_wait_sync(struct mfb_window *window) {
    if (window == 0x0) {
        return STATE_INVALID_WINDOW;
    }

    SWindowData *window_data = (SWindowData *) window;
    if (window_data->close) {
        destroy_window_data(window_data);
        return false;
    }

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    XFlush(window_data_x11->display);
    XEvent      event;
    double      current;
    uint32_t    millis = 1;
    while(1) {
        if(XEventsQueued(window_data_x11->display, QueuedAlready) > 0) {
            XNextEvent(window_data_x11->display, &event);
            processEvent(window_data, &event);
        }
        
        if(window_data->close) {
            destroy_window_data(window_data);
            return false;
        }

        current = mfb_timer_now(window_data_x11->timer);
        if (current >= g_time_for_frame) {
            mfb_timer_reset(window_data_x11->timer);
            return true;
        }
        else if(current >= g_time_for_frame * 0.8) {
            millis = 0;
        }

        usleep(millis * 1000);
        //sched_yield();
    }
    
    return true;
}